

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O2

void __thiscall pstore::index::details::linear_node::linear_node(linear_node *this,linear_node *rhs)

{
  uint64_t uVar1;
  
  *(undefined8 *)(this->signature_)._M_elems = 0x72656e4c78646e49;
  uVar1 = rhs->size_;
  this->size_ = uVar1;
  this->leaves_[0].a_ = 0;
  if (uVar1 != 0) {
    memmove(this->leaves_,rhs->leaves_,uVar1 << 3);
    return;
  }
  return;
}

Assistant:

linear_node::linear_node (linear_node const & rhs)
                    : size_{rhs.size ()} {

                std::copy (rhs.begin (), rhs.end (), &leaves_[0]);
            }